

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<unsigned_int> * __thiscall
tinyusdz::primvar::PrimVar::get_value<unsigned_int>
          (optional<unsigned_int> *__return_storage_ptr__,PrimVar *this)

{
  bool bVar1;
  optional<unsigned_int> local_20;
  
  bVar1 = is_blocked(this);
  if ((!bVar1) && (bVar1 = has_value(this), bVar1)) {
    tinyusdz::value::Value::get_value<unsigned_int>(&local_20,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_20.has_value_;
    if (local_20.has_value_ != true) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->contained = local_20.contained;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->has_value_ = false;
  __return_storage_ptr__->contained = (storage_t<unsigned_int>)0x0;
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }